

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaKf.c
# Opt level: O1

Gia_Man_t * Kf_ManDerive(Kf_Man_t *p)

{
  int iVar1;
  Jf_Par_t *pJVar2;
  undefined8 uVar3;
  word *pwVar4;
  Vec_Int_t *p_00;
  int *piVar5;
  Gia_Man_t *pGVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  
  pJVar2 = p->pPars;
  if (pJVar2->fCutMin != 0) {
    __assert_fail("!p->pPars->fCutMin",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaKf.c"
                  ,0x4f4,"Gia_Man_t *Kf_ManDerive(Kf_Man_t *)");
  }
  uVar8 = p->pGia->nObjs;
  iVar9 = (int)pJVar2->Edge + uVar8;
  iVar1 = (int)pJVar2->Area;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar11 = 0x10;
  if (0xe < (iVar9 + iVar1 * 2) - 1U) {
    iVar11 = iVar9 + iVar1 * 2;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar11;
  if (iVar11 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc((long)iVar11 << 2);
  }
  p_00->pArray = piVar5;
  if (iVar11 < (int)uVar8) {
    if (piVar5 == (int *)0x0) {
      piVar5 = (int *)malloc((long)(int)uVar8 << 2);
    }
    else {
      piVar5 = (int *)realloc(piVar5,(long)(int)uVar8 << 2);
    }
    p_00->pArray = piVar5;
    if (piVar5 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    p_00->nCap = uVar8;
  }
  if (0 < (int)uVar8) {
    memset(p_00->pArray,0,(ulong)uVar8 * 4);
  }
  p_00->nSize = uVar8;
  pGVar6 = p->pGia;
  uVar7 = (ulong)(uint)pGVar6->nObjs;
  if (0 < pGVar6->nObjs) {
    lVar14 = 0;
    do {
      if (pGVar6->pObjs == (Gia_Obj_t *)0x0) break;
      uVar3 = *(undefined8 *)(pGVar6->pObjs + lVar14);
      uVar8 = (uint)uVar3;
      if (((~uVar8 & 0x1fffffff) != 0 && -1 < (int)uVar8) &&
         ((((int)uVar8 < 0 || ((uVar8 & 0x1fffffff) == 0x1fffffff)) ||
          ((uVar8 & 0x1fffffff) != ((uint)((ulong)uVar3 >> 0x20) & 0x1fffffff))))) {
        if ((int)uVar7 <= lVar14) {
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        if (pGVar6->pRefs[lVar14] != 0) {
          if ((p->vCuts).nSize <= lVar14) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          uVar8 = (p->vCuts).pArray[lVar14];
          if (p_00->nSize <= lVar14) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          pwVar4 = (p->pMem).pPages[(int)uVar8 >> ((byte)(p->pMem).nPageSize & 0x1f)];
          lVar12 = (long)(int)(uVar8 & (p->pMem).uPageMask);
          lVar13 = (long)*(int *)((long)pwVar4 + lVar12 * 8 + 4);
          p_00->pArray[lVar14] = p_00->nSize;
          Vec_IntPush(p_00,*(int *)((long)pwVar4 + lVar13 * 4 + lVar12 * 8));
          if (0 < *(int *)((long)pwVar4 + lVar13 * 4 + lVar12 * 8)) {
            lVar10 = 0;
            do {
              uVar8 = *(uint *)((long)pwVar4 + lVar10 * 4 + lVar13 * 4 + lVar12 * 8 + 4);
              if ((int)uVar8 < 0) {
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                              ,0x12f,"int Abc_Lit2Var(int)");
              }
              Vec_IntPush(p_00,uVar8 >> 1);
              lVar10 = lVar10 + 1;
            } while (lVar10 < *(int *)((long)pwVar4 + lVar13 * 4 + lVar12 * 8));
          }
          Vec_IntPush(p_00,(int)lVar14);
        }
      }
      lVar14 = lVar14 + 1;
      pGVar6 = p->pGia;
      uVar7 = (ulong)pGVar6->nObjs;
    } while (lVar14 < (long)uVar7);
  }
  if ((p_00->nCap != 0x10) && (p_00->nSize != p_00->nCap)) {
    __assert_fail("Vec_IntCap(vMapping) == 16 || Vec_IntSize(vMapping) == Vec_IntCap(vMapping)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaKf.c"
                  ,0x502,"Gia_Man_t *Kf_ManDerive(Kf_Man_t *)");
  }
  pGVar6->vMapping = p_00;
  return pGVar6;
}

Assistant:

Gia_Man_t * Kf_ManDerive( Kf_Man_t * p )
{
    Vec_Int_t * vMapping;
    Gia_Obj_t * pObj; 
    int i, k, * pCut;
    assert( !p->pPars->fCutMin );
    vMapping = Vec_IntAlloc( Gia_ManObjNum(p->pGia) + (int)p->pPars->Edge + (int)p->pPars->Area * 2 );
    Vec_IntFill( vMapping, Gia_ManObjNum(p->pGia), 0 );
    Gia_ManForEachAnd( p->pGia, pObj, i )
    {
        if ( Gia_ObjIsBuf(pObj) || Gia_ObjRefNum(p->pGia, pObj) == 0 )
            continue;
        pCut = Kf_ObjCutBest( p, i );
        Vec_IntWriteEntry( vMapping, i, Vec_IntSize(vMapping) );
        Vec_IntPush( vMapping, Kf_CutSize(pCut) );
        for ( k = 1; k <= Kf_CutSize(pCut); k++ )
            Vec_IntPush( vMapping, Kf_CutLeaf(pCut, k) );
        Vec_IntPush( vMapping, i );
    }
    assert( Vec_IntCap(vMapping) == 16 || Vec_IntSize(vMapping) == Vec_IntCap(vMapping) );
    p->pGia->vMapping = vMapping;
//    Gia_ManMappingVerify( p->pGia );
    return p->pGia;
}